

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
          *other)

{
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  
  resizeLike<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
            (this,(EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                   *)other);
  pMVar1 = DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
           lazyAssign<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                     ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,other);
  return pMVar1;
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }